

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O1

QString * QStandardPaths::displayName(QString *__return_storage_ptr__,StandardLocation type)

{
  char *sourceText;
  
  switch(type) {
  case DesktopLocation:
    sourceText = "Desktop";
    break;
  case DocumentsLocation:
    sourceText = "Documents";
    break;
  case FontsLocation:
    sourceText = "Fonts";
    break;
  case ApplicationsLocation:
    sourceText = "Applications";
    break;
  case MusicLocation:
    sourceText = "Music";
    break;
  case MoviesLocation:
    sourceText = "Movies";
    break;
  case PicturesLocation:
    sourceText = "Pictures";
    break;
  case TempLocation:
    sourceText = "Temporary Directory";
    break;
  case HomeLocation:
    sourceText = "Home";
    break;
  case AppLocalDataLocation:
    sourceText = "Application Data";
    break;
  case CacheLocation:
    sourceText = "Cache";
    break;
  case GenericDataLocation:
    sourceText = "Shared Data";
    break;
  case RuntimeLocation:
    sourceText = "Runtime";
    break;
  case ConfigLocation:
    sourceText = "Configuration";
    break;
  case DownloadLocation:
    sourceText = "Download";
    break;
  case GenericCacheLocation:
    sourceText = "Shared Cache";
    break;
  case GenericConfigLocation:
    sourceText = "Shared Configuration";
    break;
  case AppDataLocation:
  case AppConfigLocation:
    sourceText = "Application Configuration";
    break;
  case PublicShareLocation:
    sourceText = "Public";
    break;
  case TemplatesLocation:
    sourceText = "Templates";
    break;
  case StateLocation:
    sourceText = "State";
    break;
  case GenericStateLocation:
    sourceText = "Shared State";
    break;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  QCoreApplication::translate(__return_storage_ptr__,"QStandardPaths",sourceText,(char *)0x0,-1);
  return __return_storage_ptr__;
}

Assistant:

QString QStandardPaths::displayName(StandardLocation type)
{
    switch (type) {
    case DesktopLocation:
        return QCoreApplication::translate("QStandardPaths", "Desktop");
    case DocumentsLocation:
        return QCoreApplication::translate("QStandardPaths", "Documents");
    case FontsLocation:
        return QCoreApplication::translate("QStandardPaths", "Fonts");
    case ApplicationsLocation:
        return QCoreApplication::translate("QStandardPaths", "Applications");
    case MusicLocation:
        return QCoreApplication::translate("QStandardPaths", "Music");
    case MoviesLocation:
        return QCoreApplication::translate("QStandardPaths", "Movies");
    case PicturesLocation:
        return QCoreApplication::translate("QStandardPaths", "Pictures");
    case TempLocation:
        return QCoreApplication::translate("QStandardPaths", "Temporary Directory");
    case HomeLocation:
        return QCoreApplication::translate("QStandardPaths", "Home");
    case AppLocalDataLocation:
        return QCoreApplication::translate("QStandardPaths", "Application Data");
    case CacheLocation:
        return QCoreApplication::translate("QStandardPaths", "Cache");
    case StateLocation:
        return QCoreApplication::translate("QStandardPaths", "State");
    case GenericDataLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared Data");
    case RuntimeLocation:
        return QCoreApplication::translate("QStandardPaths", "Runtime");
    case ConfigLocation:
        return QCoreApplication::translate("QStandardPaths", "Configuration");
    case GenericConfigLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared Configuration");
    case GenericCacheLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared Cache");
    case GenericStateLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared State");
    case DownloadLocation:
        return QCoreApplication::translate("QStandardPaths", "Download");
    case AppDataLocation:
    case AppConfigLocation:
        return QCoreApplication::translate("QStandardPaths", "Application Configuration");
    case PublicShareLocation:
        return QCoreApplication::translate("QStandardPaths", "Public");
    case TemplatesLocation:
        return QCoreApplication::translate("QStandardPaths", "Templates");
    }
    // not reached
    return QString();
}